

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O0

void __thiscall
ImportSource_addImportComponentBeforeAddingToModel_Test::TestBody
          (ImportSource_addImportComponentBeforeAddingToModel_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertHelper local_178 [8];
  Message local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  ComponentPtr c2;
  string local_d0 [32];
  undefined1 local_b0 [8];
  ComponentPtr c1;
  string local_98 [32];
  undefined1 local_78 [8];
  ImportSourcePtr importSource;
  ModelPtr model;
  PrinterPtr printer;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string e;
  ImportSource_addImportComponentBeforeAddingToModel_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"this_place.cellml\">\n    <component component_ref=\"c_other\" name=\"c2\"/>\n  </import>\n  <component name=\"c1\"/>\n  <encapsulation>\n    <component_ref component=\"c1\">\n      <component_ref component=\"c2\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Printer::create();
  libcellml::Model::create();
  libcellml::ImportSource::create();
  peVar2 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"this_place.cellml",
             (allocator<char> *)
             ((long)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar2);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"c1",
             (allocator<char> *)
             ((long)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"c2",&local_109);
  libcellml::Component::create((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar3 + 0x10));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"c_other",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ImportedEntity::setImportReference((string *)(peVar3 + 0x10));
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b0);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&importSource.
                          super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar5 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_168,SUB81(peVar5,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_148,"e","printer->printModel(model)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_168);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/import_source/import_source.cpp"
               ,0xfe,pcVar6);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_b0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_78);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ImportSource, addImportComponentBeforeAddingToModel)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"this_place.cellml\">\n"
        "    <component component_ref=\"c_other\" name=\"c2\"/>\n"
        "  </import>\n"
        "  <component name=\"c1\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"c1\">\n"
        "      <component_ref component=\"c2\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    auto importSource = libcellml::ImportSource::create();

    importSource->setUrl("this_place.cellml");

    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create("c2");

    c2->setImportSource(importSource);
    c2->setImportReference("c_other");

    c1->addComponent(c2);
    model->addComponent(c1);

    EXPECT_EQ(e, printer->printModel(model));
}